

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transreg.cpp
# Opt level: O0

void __thiscall
icu_63::TransliteratorRegistry::registerSTV
          (TransliteratorRegistry *this,UnicodeString *source,UnicodeString *target,
          UnicodeString *variant)

{
  int8_t iVar1;
  UBool UVar2;
  int32_t iVar3;
  uint uVar4;
  Hashtable *this_00;
  UnicodeString *pUVar5;
  ConstChar16Ptr *this_01;
  UnicodeString *local_e8;
  Hashtable *local_d8;
  uint32_t varMask;
  uint32_t addMask;
  UnicodeString *variantEntry;
  int32_t variantListIndex;
  ConstChar16Ptr local_60 [3];
  ConstChar16Ptr local_48;
  int32_t local_3c;
  Hashtable *pHStack_38;
  int32_t size;
  Hashtable *targets;
  UnicodeString *pUStack_28;
  UErrorCode status;
  UnicodeString *variant_local;
  UnicodeString *target_local;
  UnicodeString *source_local;
  TransliteratorRegistry *this_local;
  
  targets._4_4_ = U_ZERO_ERROR;
  pUStack_28 = variant;
  variant_local = target;
  target_local = source;
  source_local = (UnicodeString *)this;
  pHStack_38 = (Hashtable *)Hashtable::get(&this->specDAG,source);
  pUVar5 = target_local;
  if (pHStack_38 == (Hashtable *)0x0) {
    local_3c = 3;
    this_01 = &local_48;
    ConstChar16Ptr::ConstChar16Ptr(this_01,L"Any");
    iVar1 = icu_63::UnicodeString::compare(pUVar5,this_01,3);
    ConstChar16Ptr::~ConstChar16Ptr(&local_48);
    pUVar5 = target_local;
    if (iVar1 == '\0') {
      local_3c = 0x7d;
    }
    else {
      this_01 = local_60;
      ConstChar16Ptr::ConstChar16Ptr(this_01,L"Lat");
      iVar1 = icu_63::UnicodeString::compare(pUVar5,this_01,3);
      ConstChar16Ptr::~ConstChar16Ptr(local_60);
      if (iVar1 == '\0') {
        local_3c = 0x17;
      }
    }
    this_00 = (Hashtable *)UMemory::operator_new((UMemory *)0x58,(size_t)this_01);
    local_d8 = (Hashtable *)0x0;
    if (this_00 != (Hashtable *)0x0) {
      Hashtable::Hashtable(this_00,'\x01',local_3c,(UErrorCode *)((long)&targets + 4));
      local_d8 = this_00;
    }
    pHStack_38 = local_d8;
    UVar2 = ::U_FAILURE(targets._4_4_);
    if (UVar2 != '\0') {
      return;
    }
    if (pHStack_38 == (Hashtable *)0x0) {
      return;
    }
    Hashtable::put(&this->specDAG,target_local,pHStack_38,(UErrorCode *)((long)&targets + 4));
  }
  pUVar5 = pUStack_28;
  variantEntry._0_4_ = UVector::indexOf(&this->variantList,pUStack_28,0);
  if ((int32_t)variantEntry < 0) {
    iVar3 = UVector::size(&this->variantList);
    if (0x1e < iVar3) {
      return;
    }
    pUVar5 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)pUVar5);
    local_e8 = (UnicodeString *)0x0;
    if (pUVar5 != (UnicodeString *)0x0) {
      icu_63::UnicodeString::UnicodeString(pUVar5,pUStack_28);
      local_e8 = pUVar5;
    }
    if (local_e8 != (UnicodeString *)0x0) {
      UVector::addElement(&this->variantList,local_e8,(UErrorCode *)((long)&targets + 4));
      UVar2 = ::U_SUCCESS(targets._4_4_);
      if (UVar2 != '\0') {
        iVar3 = UVector::size(&this->variantList);
        variantEntry._0_4_ = iVar3 + -1;
      }
    }
    if ((int32_t)variantEntry < 0) {
      return;
    }
  }
  uVar4 = Hashtable::geti(pHStack_38,variant_local);
  Hashtable::puti(pHStack_38,variant_local,uVar4 | 1 << ((byte)(int32_t)variantEntry & 0x1f),
                  (UErrorCode *)((long)&targets + 4));
  return;
}

Assistant:

void TransliteratorRegistry::registerSTV(const UnicodeString& source,
                                         const UnicodeString& target,
                                         const UnicodeString& variant) {
    // assert(source.length() > 0);
    // assert(target.length() > 0);
    UErrorCode status = U_ZERO_ERROR;
    Hashtable *targets = (Hashtable*) specDAG.get(source);
    if (targets == 0) {
        int32_t size = 3;
        if (source.compare(ANY,3) == 0) {
            size = ANY_TARGETS_INIT_SIZE;
        } else if (source.compare(LAT,3) == 0) {
            size = LAT_TARGETS_INIT_SIZE;
        }
        targets = new Hashtable(TRUE, size, status);
        if (U_FAILURE(status) || targets == NULL) {
            return;
        }
        specDAG.put(source, targets, status);
    }
    int32_t variantListIndex = variantList.indexOf((void*) &variant, 0);
    if (variantListIndex < 0) {
        if (variantList.size() >= VARIANT_LIST_MAX_SIZE) {
            // can't handle any more variants
            return;
        }
        UnicodeString *variantEntry = new UnicodeString(variant);
        if (variantEntry != NULL) {
            variantList.addElement(variantEntry, status);
            if (U_SUCCESS(status)) {
                variantListIndex = variantList.size() - 1;
            }
        }
        if (variantListIndex < 0) {
            return;
        }
    }
    uint32_t addMask = 1 << variantListIndex;
    uint32_t varMask = targets->geti(target);
    targets->puti(target, varMask | addMask, status);
}